

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O2

int cueify_full_toc_deserialize(cueify_full_toc *t,uint8_t *buffer,size_t size)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  ushort uVar4;
  byte *pbVar5;
  byte bVar6;
  cueify_full_toc_private *toc;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  
  if (buffer == (uint8_t *)0x0 || t == (cueify_full_toc *)0x0) {
    return 3;
  }
  iVar3 = 6;
  if (size < 4) {
    return 6;
  }
  uVar4 = *(ushort *)buffer << 8 | *(ushort *)buffer >> 8;
  if ((ulong)uVar4 <= size - 2) {
    if ((int)(uVar4 - 2) % 0xb == 0) {
      bVar9 = 0;
      memset(t,0,0x106c);
      *(uint8_t *)t = buffer[2];
      *(uint8_t *)((long)t + 1) = buffer[3];
      *(undefined2 *)((long)t + 2) = 0;
      pbVar5 = buffer + 4;
      bVar6 = 0;
LAB_0014da5b:
      if (pbVar5 < buffer + (ulong)uVar4 + 2) {
        if ((pbVar5[1] & 0xf0) != 0x50) {
          bVar2 = pbVar5[3];
          uVar7 = (ulong)bVar2;
          if (uVar7 < 100) {
            lVar8 = uVar7 * 9;
            *(byte *)((long)t + lVar8 + 4) = *pbVar5;
            *(byte *)((long)t + lVar8 + 5) = pbVar5[1] >> 4;
            *(byte *)((long)t + lVar8 + 6) = pbVar5[1] & 0xf;
            *(byte *)((long)t + lVar8 + 7) = pbVar5[4];
            *(byte *)((long)t + lVar8 + 8) = pbVar5[5];
            *(byte *)((long)t + lVar8 + 9) = pbVar5[6];
            *(byte *)((long)t + lVar8 + 10) = pbVar5[8];
            *(byte *)((long)t + lVar8 + 0xb) = pbVar5[9];
            *(byte *)((long)t + lVar8 + 0xc) = pbVar5[10];
          }
          else {
            if (uVar7 != 0xa2) {
              if (bVar2 == 0xa1) {
                lVar8 = (ulong)*pbVar5 * 0x21;
                *(byte *)((long)t + lVar8 + 0x3a0) = *pbVar5;
                *(byte *)((long)t + lVar8 + 0x3a1) = pbVar5[1] >> 4;
                *(byte *)((long)t + lVar8 + 0x3a2) = pbVar5[1] & 0xf;
                *(byte *)((long)t + lVar8 + 0x3a3) = pbVar5[4];
                *(byte *)((long)t + lVar8 + 0x3a4) = pbVar5[5];
                *(byte *)((long)t + lVar8 + 0x3a5) = pbVar5[6];
                bVar2 = pbVar5[8];
                *(byte *)((long)t + lVar8 + 0x3a6) = bVar2;
                *(byte *)((long)t + lVar8 + 0x389) = bVar2;
                if (bVar6 < bVar2 || bVar6 == 0) {
                  *(byte *)((long)t + 3) = bVar2;
                  bVar6 = bVar2;
                }
                *(byte *)((long)t + lVar8 + 0x3a7) = pbVar5[9];
                pbVar1 = pbVar5 + 10;
                pbVar5 = pbVar5 + 0xb;
                *(byte *)((long)t + lVar8 + 0x3a8) = *pbVar1;
              }
              else if (bVar2 == 0xa0) {
                lVar8 = (ulong)*pbVar5 * 0x21;
                *(byte *)((long)t + lVar8 + 0x397) = *pbVar5;
                *(byte *)((long)t + lVar8 + 0x398) = pbVar5[1] >> 4;
                *(byte *)((long)t + lVar8 + 0x399) = pbVar5[1] & 0xf;
                *(byte *)((long)t + lVar8 + 0x39a) = pbVar5[4];
                *(byte *)((long)t + lVar8 + 0x39b) = pbVar5[5];
                *(byte *)((long)t + lVar8 + 0x39c) = pbVar5[6];
                bVar2 = pbVar5[8];
                *(byte *)((long)t + lVar8 + 0x39d) = bVar2;
                *(byte *)((long)t + lVar8 + 0x388) = bVar2;
                if (bVar2 <= (byte)(bVar9 - 1)) {
                  *(byte *)((long)t + 2) = bVar2;
                  bVar9 = bVar2;
                }
                bVar2 = pbVar5[9];
                *(byte *)((long)t + lVar8 + 0x39e) = bVar2;
                *(byte *)((long)t + lVar8 + 0x38a) = bVar2;
                pbVar1 = pbVar5 + 10;
                pbVar5 = pbVar5 + 0xb;
                *(byte *)((long)t + lVar8 + 0x39f) = *pbVar1;
              }
              goto LAB_0014da5b;
            }
            lVar8 = (ulong)*pbVar5 * 0x21;
            *(byte *)((long)t + lVar8 + 0x38e) = *pbVar5;
            *(byte *)((long)t + lVar8 + 0x38f) = pbVar5[1] >> 4;
            *(byte *)((long)t + lVar8 + 0x390) = pbVar5[1] & 0xf;
            *(byte *)((long)t + lVar8 + 0x391) = pbVar5[4];
            *(byte *)((long)t + lVar8 + 0x392) = pbVar5[5];
            *(byte *)((long)t + lVar8 + 0x393) = pbVar5[6];
            *(byte *)((long)t + lVar8 + 0x394) = pbVar5[8];
            *(byte *)((long)t + lVar8 + 0x395) = pbVar5[9];
            bVar2 = pbVar5[10];
            *(byte *)((long)t + lVar8 + 0x396) = bVar2;
            *(undefined2 *)((long)t + lVar8 + 0x38b) = *(undefined2 *)((long)t + lVar8 + 0x394);
            *(byte *)((long)t + lVar8 + 0x38d) = bVar2;
          }
        }
        pbVar5 = pbVar5 + 0xb;
        goto LAB_0014da5b;
      }
      iVar3 = 0;
    }
    else {
      iVar3 = 7;
    }
  }
  return iVar3;
}

Assistant:

int cueify_full_toc_deserialize(cueify_full_toc *t,
				const uint8_t * const buffer,
				size_t size) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    uint16_t toc_length;
    const uint8_t *bp;
    uint8_t offset;

    if (t == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* TOC Data Length */
    toc_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < toc_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if ((toc_length - 2) % 11 != 0) {
	return CUEIFY_ERR_CORRUPTED;
    }

    memset(toc, 0, sizeof(cueify_full_toc_private));

    /* First Complete Session Number */
    toc->first_session_number = buffer[2];
    /* Last Complete Session Number */
    toc->last_session_number = buffer[3];

    toc->first_track_number = toc->last_track_number = 0;

    /* TOC Track Descriptor(s) */
    bp = buffer + 4;
    while (bp < buffer + toc_length + 2) {
	if ((bp[1] >> 4) == 0x05) {
	    /* Ignore extra ATIP/Interval data */
	    bp += 11;
	    continue;
	}
	/* Track Number */
	offset = bp[3];
	if (offset < MAX_TRACKS) {
	    /* standard track */
	    /* Session Number */
	    toc->tracks[offset].session = *bp++;
	    /* ADR */
	    toc->tracks[offset].adr = *bp >> 4;
	    /* CONTROL */
	    toc->tracks[offset].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->tracks[offset].atime.min = *bp++;
	    /* Sec */
	    toc->tracks[offset].atime.sec = *bp++;
	    /* Frame */
	    toc->tracks[offset].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN */
	    toc->tracks[offset].offset.min = *bp++;
	    /* PSEC */
	    toc->tracks[offset].offset.sec = *bp++;
	    /* PFRAME */
	    toc->tracks[offset].offset.frm = *bp++;
	} else if (offset == 0xA0) {
	    /* POINT == 0xA0 */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[1].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[1].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[1].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[1].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[1].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[1].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN == First Track Number */
	    toc->sessions[offset].pseudotracks[1].offset.min = *bp++;
	    toc->sessions[offset].first_track_number =
		toc->sessions[offset].pseudotracks[1].offset.min;
	    if (toc->first_track_number == 0 ||
		toc->sessions[offset].first_track_number <
		toc->first_track_number) {
		toc->first_track_number =
		    toc->sessions[offset].first_track_number;
	    }
	    /* PSEC == Disc Type */
	    toc->sessions[offset].pseudotracks[1].offset.sec = *bp++;
	    toc->sessions[offset].session_type =
		toc->sessions[offset].pseudotracks[1].offset.sec;
	    /* PFRAME == Reserved */
	    toc->sessions[offset].pseudotracks[1].offset.frm = *bp++;
	} else if (offset == 0xA1) {
	    /* POINT == 0xA1 */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[2].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[2].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[2].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[2].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[2].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[2].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN == Last Track Number */
	    toc->sessions[offset].pseudotracks[2].offset.min = *bp++;
	    toc->sessions[offset].last_track_number =
		toc->sessions[offset].pseudotracks[2].offset.min;
	    if (toc->last_track_number == 0 ||
		toc->sessions[offset].last_track_number >
		toc->last_track_number) {
		toc->last_track_number =
		    toc->sessions[offset].last_track_number;
	    }
	    /* PSEC == Reserved */
	    toc->sessions[offset].pseudotracks[2].offset.sec = *bp++;
	    /* PFRAME == Reserved */
	    toc->sessions[offset].pseudotracks[2].offset.frm = *bp++;
	} else if (offset == 0xA2) {
	    /* POINT == 0xA2 */
	    /* Session Number */
	    offset = *bp++;
	    /* Session Number */
	    toc->sessions[offset].pseudotracks[0].session = offset;
	    /* ADR */
	    toc->sessions[offset].pseudotracks[0].adr = *bp >> 4;
	    /* CONTROL */
	    toc->sessions[offset].pseudotracks[0].control = *bp & 0xF;
	    bp++;
	    /* TNO */
	    bp++;
	    /* POINT */
	    bp++;
	    /* Min */
	    toc->sessions[offset].pseudotracks[0].atime.min = *bp++;
	    /* Sec */
	    toc->sessions[offset].pseudotracks[0].atime.sec = *bp++;
	    /* Frame */
	    toc->sessions[offset].pseudotracks[0].atime.frm = *bp++;
	    /* Zero */
	    bp++;
	    /* PMIN */
	    toc->sessions[offset].pseudotracks[0].offset.min = *bp++;
	    /* PSEC */
	    toc->sessions[offset].pseudotracks[0].offset.sec = *bp++;
	    /* PFRAME */
	    toc->sessions[offset].pseudotracks[0].offset.frm = *bp++;
	    toc->sessions[offset].leadout =
		toc->sessions[offset].pseudotracks[0].offset;
	}
    }

    return CUEIFY_OK;
}